

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O0

void zddPrintCoverAux(DdManager *zdd,DdNode *node,int level,int *list)

{
  DdNode *node_00;
  DdNode *node_01;
  int iVar1;
  DdHalfWord local_50;
  DdNode *base;
  int v;
  int i;
  DdNode *Nnv;
  DdNode *Nv;
  int *list_local;
  int level_local;
  DdNode *node_local;
  DdManager *zdd_local;
  
  if (*(int *)((ulong)node & 0xfffffffffffffffe) == 0x7fffffff) {
    if (node == zdd->one) {
      if (level == zdd->sizeZ) {
        for (base._4_4_ = 0; base._4_4_ < zdd->sizeZ; base._4_4_ = base._4_4_ + 2) {
          iVar1 = list[base._4_4_] * 4 + list[base._4_4_ + 1];
          if (iVar1 == 0) {
            putc(0x2d,(FILE *)zdd->out);
          }
          else if (iVar1 == 4) {
            putc(0x31,(FILE *)zdd->out);
          }
          else if (iVar1 == 1) {
            putc(0x30,(FILE *)zdd->out);
          }
          else {
            putc(0x40,(FILE *)zdd->out);
          }
        }
        fprintf((FILE *)zdd->out," 1\n");
      }
      else {
        list[zdd->invpermZ[level]] = 0;
        zddPrintCoverAux(zdd,node,level + 1,list);
      }
    }
  }
  else {
    if (node->index == 0x7fffffff) {
      local_50 = node->index;
    }
    else {
      local_50 = zdd->permZ[node->index];
    }
    if (level == local_50) {
      node_00 = (node->type).kids.E;
      node_01 = (node->type).kids.T;
      if (node_01 == node_00) {
        list[node->index] = 2;
        zddPrintCoverAux(zdd,node_00,level + 1,list);
      }
      else {
        list[node->index] = 1;
        zddPrintCoverAux(zdd,node_01,level + 1,list);
        list[node->index] = 0;
        zddPrintCoverAux(zdd,node_00,level + 1,list);
      }
    }
    else {
      list[zdd->invpermZ[level]] = 0;
      zddPrintCoverAux(zdd,node,level + 1,list);
    }
  }
  return;
}

Assistant:

static void
zddPrintCoverAux(
  DdManager * zdd /* manager */,
  DdNode * node /* current node */,
  int  level /* depth in the recursion */,
  int * list /* current recursion path */)
{
    DdNode      *Nv, *Nnv;
    int         i, v;
    DdNode      *base = DD_ONE(zdd);

    if (Cudd_IsConstant(node)) {
        if (node == base) {
            /* Check for missing variable. */
            if (level != zdd->sizeZ) {
                list[zdd->invpermZ[level]] = 0;
                zddPrintCoverAux(zdd, node, level + 1, list);
                return;
            }
            /* Terminal case: Print one cube based on the current recursion
            ** path.
            */
            for (i = 0; i < zdd->sizeZ; i += 2) {
                v = list[i] * 4 + list[i+1];
                if (v == 0)
                    (void) putc('-',zdd->out);
                else if (v == 4)
                    (void) putc('1',zdd->out);
                else if (v == 1)
                    (void) putc('0',zdd->out);
                else
                    (void) putc('@',zdd->out); /* should never happen */
            }
            (void) fprintf(zdd->out," 1\n");
        }
    } else {
        /* Check for missing variable. */
        if (level != cuddIZ(zdd,node->index)) {
            list[zdd->invpermZ[level]] = 0;
            zddPrintCoverAux(zdd, node, level + 1, list);
            return;
        }

        Nnv = cuddE(node);
        Nv = cuddT(node);
        if (Nv == Nnv) {
            list[node->index] = 2;
            zddPrintCoverAux(zdd, Nnv, level + 1, list);
            return;
        }

        list[node->index] = 1;
        zddPrintCoverAux(zdd, Nv, level + 1, list);
        list[node->index] = 0;
        zddPrintCoverAux(zdd, Nnv, level + 1, list);
    }
    return;

}